

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  iterator __position;
  iterator __position_00;
  pointer pBVar9;
  pointer pBVar10;
  Mat *this_02;
  bool bVar11;
  undefined1 auVar12 [16];
  int *piVar13;
  byte bVar14;
  float *pfVar15;
  ulong uVar16;
  pointer pfVar17;
  BBoxRect *__args;
  pointer pMVar18;
  float *pfVar19;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  float *pfVar23;
  int iVar24;
  long lVar25;
  undefined4 *puVar26;
  pointer pvVar27;
  uint uVar28;
  long lVar29;
  float fVar30;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar31;
  float fVar33;
  undefined1 in_XMM1 [16];
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_208;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_1e8;
  YoloDetectionOutput *local_1c8;
  float local_1bc;
  vector<float,_std::allocator<float>_> local_1b8;
  int local_1a0;
  Allocator *local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  int local_180;
  ulong local_178;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_168;
  ulong local_150;
  vector<float,_std::allocator<float>_> local_148;
  uint local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_110;
  Option *local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  undefined1 local_c8 [16];
  int local_b8;
  ulong local_a8;
  long local_a0;
  pointer local_98;
  ulong local_90;
  ulong local_88;
  float *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pMVar18 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = bottom_top_blobs;
  local_108 = opt;
  if ((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar18) {
    uVar20 = 0;
    local_1c8 = this;
    do {
      iVar24 = pMVar18[uVar20].c / this->num_box;
      if (iVar24 != this->num_class + 5) {
        iVar24 = -1;
        goto LAB_0049c8f6;
      }
      local_128 = *(float **)&pMVar18[uVar20].w;
      uStack_120 = 0;
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8 = uVar20;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize(&local_1e8,(long)this->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_208,(long)this->num_box);
      if (0 < this->num_box) {
        local_98 = pMVar18 + uVar20;
        auVar32._4_4_ = -(uint)(0 < (int)(float)local_128);
        auVar32._0_4_ = -(uint)(0 < (int)(float)local_128);
        auVar32._8_4_ = -(uint)(0 < (int)local_128._4_4_);
        auVar32._12_4_ = -(uint)(0 < (int)local_128._4_4_);
        local_12c = movmskpd((int)local_98,auVar32);
        bVar14 = (byte)local_12c;
        auVar12._4_4_ = (float)(int)local_128._4_4_;
        auVar12._0_4_ = (float)(int)(float)local_128;
        auVar12._8_4_ = (float)(int)uStack_120;
        auVar12._12_4_ = (float)uStack_120._4_4_;
        in_XMM1 = rcpps(in_XMM1,auVar12);
        local_78 = in_XMM1._0_4_;
        fStack_74 = in_XMM1._4_4_;
        fStack_70 = in_XMM1._8_4_;
        fStack_6c = in_XMM1._12_4_;
        local_78 = (1.0 - (float)(int)(float)local_128 * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)(int)local_128._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (0.0 - (float)(int)uStack_120 * fStack_70) * fStack_70 + fStack_70;
        fStack_6c = (0.0 - (float)uStack_120._4_4_ * fStack_6c) * fStack_6c + fStack_6c;
        local_a0 = (long)iVar24;
        local_90 = (ulong)local_128._4_4_;
        local_88 = (ulong)local_128 & 0xffffffff;
        lVar29 = 0;
        do {
          lVar25 = lVar29 * local_a0;
          local_f8 = *(undefined8 *)((long)(this->biases).data + lVar29 * 8);
          uStack_f0 = 0;
          sVar6 = local_98->cstep;
          pvVar7 = local_98->data;
          sVar8 = local_98->elemsize;
          local_180 = this->num_class;
          uStack_188._0_4_ = local_98->h;
          uStack_188._4_4_ = local_98->d;
          local_178 = local_98->elemsize;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((lVar25 + 5) * local_98->cstep * local_178 + (long)local_98->data);
          local_1a0 = local_98->elempack;
          local_198 = local_98->allocator;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)local_178;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(local_178 >> 0x20);
          local_178 = ((long)local_98->d * local_178 * (long)local_98->h * (long)local_98->w + 0xf &
                      0xfffffffffffffff0) / local_178;
          local_190._0_4_ = local_98->dims;
          local_190._4_4_ = local_98->w;
          (*this->softmax->_vptr_Layer[9])(this->softmax,&local_1b8,local_108);
          local_100 = lVar29;
          if (bVar14 >> 1 != 0) {
            pfVar15 = (float *)(sVar6 * lVar25 * sVar8 + (long)pvVar7);
            pfVar23 = (float *)((lVar25 + 1) * sVar6 * sVar8 + (long)pvVar7);
            puVar26 = (undefined4 *)((lVar25 + 2) * sVar6 * sVar8 + (long)pvVar7);
            pfVar19 = (float *)((lVar25 + 3) * sVar6 * sVar8 + (long)pvVar7);
            pfVar22 = (float *)((lVar25 + 4) * sVar6 * sVar8 + (long)pvVar7);
            local_f8 = CONCAT44(local_f8._4_4_ * 0.5,(float)local_f8 * 0.5);
            uStack_f0 = CONCAT44(uStack_f0._4_4_ * 0.0,(float)uStack_f0 * 0.0);
            local_150 = 0;
            do {
              if ((local_12c & 1) != 0) {
                local_68 = ZEXT416((uint)(float)(int)local_150);
                lVar29 = 0;
                uVar20 = 0;
                do {
                  local_128 = (float *)CONCAT44(local_128._4_4_,*puVar26);
                  local_d8 = *pfVar19;
                  local_e8 = -*pfVar15;
                  fStack_e4 = -*pfVar23;
                  uStack_e0 = 0x80000000;
                  uStack_dc = 0x80000000;
                  local_80 = pfVar15;
                  local_48 = expf(local_e8);
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(fStack_e4);
                  fStack_54 = extraout_XMM0_Db_00;
                  local_e8 = expf(local_d8);
                  local_d8 = expf((float)local_128);
                  local_128 = pfVar22;
                  fVar30 = expf(-*pfVar22);
                  lVar25 = local_100;
                  if ((long)local_1c8->num_class < 1) {
                    iVar24 = 0;
                    auVar32 = ZEXT816(0);
                  }
                  else {
                    pfVar15 = (float *)(local_150 *
                                        CONCAT44(local_1b8.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_,local_1b8.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_) * (long)local_190._4_4_ + lVar29 +
                                       (long)local_1b8.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
                    fVar34 = 0.0;
                    uVar21 = 0;
                    uVar16 = 0;
                    do {
                      fVar31 = *pfVar15;
                      bVar11 = fVar34 < fVar31;
                      if (fVar31 <= fVar34) {
                        fVar31 = fVar34;
                      }
                      fVar34 = fVar31;
                      auVar32 = ZEXT416((uint)fVar34);
                      if (bVar11) {
                        uVar16 = uVar21 & 0xffffffff;
                      }
                      iVar24 = (int)uVar16;
                      uVar21 = uVar21 + 1;
                      pfVar15 = (float *)((long)pfVar15 +
                                         CONCAT44(local_1b8.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_,local_1b8.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_) * local_178);
                    } while ((long)local_1c8->num_class != uVar21);
                  }
                  in_XMM1._4_12_ = auVar32._4_12_;
                  in_XMM1._0_4_ = auVar32._0_4_ / (fVar30 + 1.0);
                  local_1bc = in_XMM1._0_4_;
                  if (local_1c8->confidence_threshold <= in_XMM1._0_4_) {
                    auVar37._0_4_ = local_48 + 1.0;
                    auVar37._4_4_ = local_58 + 1.0;
                    auVar37._8_4_ = fStack_44 + 0.0;
                    auVar37._12_4_ = fStack_54 + 0.0;
                    auVar32 = rcpps(in_XMM1,auVar37);
                    fVar30 = auVar32._0_4_;
                    fVar34 = auVar32._4_4_;
                    fVar30 = ((float)(int)uVar20 + fVar30 + (1.0 - auVar37._0_4_ * fVar30) * fVar30)
                             * local_78;
                    fVar34 = ((float)local_68._0_4_ + fVar34 +
                             (1.0 - auVar37._4_4_ * fVar34) * fVar34) * fStack_74;
                    fVar35 = local_d8 * (float)local_f8 * local_78;
                    fVar36 = local_e8 * local_f8._4_4_ * fStack_74;
                    fVar31 = fVar30 - fVar35;
                    fVar33 = fVar34 - fVar36;
                    fVar35 = fVar35 + fVar30;
                    fVar36 = fVar36 + fVar34;
                    in_XMM1 = CONCAT88(CONCAT44(fVar36,fVar35),CONCAT44(fVar33,fVar31));
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1e8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_100);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_c8 = in_XMM1;
                    local_b8 = iVar24;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_c8);
                    }
                    else {
                      (__position._M_current)->label = iVar24;
                      (__position._M_current)->xmin = fVar31;
                      (__position._M_current)->ymin = fVar33;
                      (__position._M_current)->xmax = fVar35;
                      (__position._M_current)->ymax = fVar36;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_208.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar25);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_1bc);
                    }
                    else {
                      *__position_00._M_current = local_1bc;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar15 = local_80 + 1;
                  pfVar23 = pfVar23 + 1;
                  puVar26 = puVar26 + 1;
                  pfVar19 = pfVar19 + 1;
                  pfVar22 = local_128 + 1;
                  uVar20 = uVar20 + 1;
                  lVar29 = lVar29 + 4;
                } while (uVar20 != local_88);
              }
              local_150 = local_150 + 1;
            } while (local_150 != local_90);
          }
          lVar29 = local_100;
          this = local_1c8;
          piVar13 = (int *)CONCAT44(local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (local_198 == (Allocator *)0x0) {
                if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
                }
              }
              else {
                (*local_198->_vptr_Allocator[3])();
              }
            }
          }
          local_178 = 0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          local_1a0 = 0;
          local_190 = 0;
          uStack_188 = 0;
          local_180 = 0;
          lVar29 = lVar29 + 1;
        } while (lVar29 < this->num_box);
      }
      if (0 < this->num_box) {
        lVar29 = 8;
        lVar25 = 0;
        do {
          pvVar27 = local_208.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_168,
                     local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1e8.
                             super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8),
                     *(undefined8 *)
                      ((long)&((local_1e8.
                                super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar29));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_148,
                     local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,*(undefined8 *)((long)pvVar27 + lVar29 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar27->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar29));
          lVar25 = lVar25 + 1;
          lVar29 = lVar29 + 0x18;
        } while (lVar25 < this->num_box);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_208);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector(&local_1e8);
      uVar20 = local_a8 + 1;
      pMVar18 = (local_110->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)(((long)(local_110->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar18 >> 3)
                             * -0x71c71c71c71c71c7));
  }
  if ((local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    qsort_descent_inplace<ncnn::BBoxRect>
              (&local_168,&local_148,0,
               (int)((ulong)((long)local_148.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_148.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
  }
  pBVar9 = local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar10 = local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8 = (YoloDetectionOutput *)CONCAT44(local_1c8._4_4_,this->nms_threshold);
  pvVar27 = (pointer)(((long)local_168.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_168.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_1b8,(size_type)pvVar27,(allocator_type *)&local_208);
  if (pBVar9 == pBVar10) {
    local_208.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    pfVar15 = &(local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    lVar29 = 0;
    do {
      uVar3 = ((BBoxRect *)(pfVar15 + -2))->xmin;
      uVar4 = ((BBoxRect *)(pfVar15 + -2))->ymin;
      local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar29] =
           ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar15 - (float)uVar3);
      lVar29 = lVar29 + 1;
      pfVar15 = pfVar15 + 5;
    } while ((long)&(pvVar27->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start + (ulong)(pvVar27 == (pointer)0x0) != lVar29);
    local_208.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (pBVar9 != pBVar10) {
      do {
        uVar28 = (uint)((ulong)((long)local_1e8.
                                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1e8.
                                     super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if ((int)uVar28 < 1) {
LAB_0049c681:
          if (local_1e8.
              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1e8.
              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1e8,
                       (iterator)
                       local_1e8.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_208);
          }
          else {
            *(pointer *)
             local_1e8.
             super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish =
                 local_208.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1e8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_1e8.
                                 super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8);
          }
        }
        else {
          pBVar10 = local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                    (long)local_208.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          fVar30 = pBVar10->xmin;
          bVar11 = true;
          uVar20 = 0;
          do {
            pBVar9 = (&((local_1e8.
                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                       super__Vector_impl_data._M_start)[uVar20];
            fVar34 = local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pBVar9].xmax;
            fVar31 = 0.0;
            if (fVar30 <= fVar34) {
              pBVar1 = local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pBVar9;
              fVar33 = pBVar10->xmax;
              fVar35 = pBVar1->xmin;
              if (fVar35 <= fVar33) {
                fVar36 = pBVar10->ymin;
                fVar38 = pBVar1->ymax;
                if (fVar36 <= fVar38) {
                  fVar2 = pBVar10->ymax;
                  fVar39 = pBVar1->ymin;
                  if (fVar39 <= fVar2) {
                    if (fVar33 <= fVar34) {
                      fVar34 = fVar33;
                    }
                    if (fVar35 <= fVar30) {
                      fVar35 = fVar30;
                    }
                    if (fVar2 <= fVar38) {
                      fVar38 = fVar2;
                    }
                    if (fVar39 <= fVar36) {
                      fVar39 = fVar36;
                    }
                    fVar31 = (fVar38 - fVar39) * (fVar34 - fVar35);
                  }
                }
              }
            }
            if (local_1c8._0_4_ <
                fVar31 / ((local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [(long)local_208.
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start] - fVar31) +
                         local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pBVar9])) {
              bVar11 = false;
            }
            uVar20 = uVar20 + 1;
          } while ((uVar28 & 0x7fffffff) != uVar20);
          if (bVar11) goto LAB_0049c681;
        }
        local_208.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&((local_208.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start + 1);
      } while (local_208.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start < pvVar27);
    }
  }
  if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar24 = 0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar20 = 0;
    local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = &((BBoxRect *)0x0)->xmin;
    do {
      pBVar10 = (&((local_1e8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                  super__Vector_impl_data._M_start)[uVar20];
      __args = local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
               .super__Vector_impl_data._M_start + (long)pBVar10;
      if ((BBoxRect *)
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (BBoxRect *)
          CONCAT44(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,
                   local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_)) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1b8,
                   (iterator)
                   local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        ((BBoxRect *)
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->label = __args->label;
        fVar30 = __args->ymin;
        fVar34 = __args->xmax;
        fVar31 = __args->ymax;
        ((BBoxRect *)
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->xmin = __args->xmin;
        ((BBoxRect *)
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->ymin = fVar30;
        ((BBoxRect *)
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->xmax = fVar34;
        ((BBoxRect *)
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->ymax = fVar31;
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if (local_208.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_208.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_208,
                   (iterator)
                   local_208.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)pBVar10);
      }
      else {
        *(float *)local_208.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pBVar10];
        local_208.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_208.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)local_1e8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1e8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar28 = (int)((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * -0x33333333;
  if (uVar28 != 0) {
    this_02 = (local_110->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_02,6,uVar28,4,local_108->blob_allocator);
    iVar24 = -100;
    if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
       (iVar24 = 0, 0 < (int)uVar28)) {
      iVar5 = this_02->w;
      sVar6 = this_02->elemsize;
      pfVar17 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 4;
      pfVar15 = (float *)((long)this_02->data + 0x14);
      iVar24 = 0;
      uVar20 = 0;
      do {
        fVar30 = *(float *)((long)&((local_208.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_start + uVar20 * 4);
        pfVar15[-5] = (float)((int)*pfVar17 + 1);
        pfVar15[-4] = fVar30;
        pfVar15[-3] = pfVar17[-4];
        pfVar15[-2] = pfVar17[-3];
        pfVar15[-1] = pfVar17[-2];
        *pfVar15 = pfVar17[-1];
        uVar20 = uVar20 + 1;
        pfVar17 = pfVar17 + 5;
        pfVar15 = (float *)((long)pfVar15 + (long)iVar5 * sVar6);
      } while ((uVar28 & 0x7fffffff) != uVar20);
    }
  }
  if (local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0049c8f6:
  if (local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar24;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / w);
                    float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / h);

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}